

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::SerializeWithCachedSizes
          (GeneratedCodeInfo_Annotation *this,CodedOutputStream *output)

{
  byte *pbVar1;
  string *psVar2;
  void *pvVar3;
  bool bVar4;
  uint *puVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  uint uVar9;
  int index;
  uint uVar10;
  ulong value;
  ulong uVar11;
  
  if (0 < (this->path_).current_size_) {
    if (output->buffer_size_ < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,10);
    }
    else {
      *output->buffer_ = '\n';
      output->buffer_ = output->buffer_ + 1;
      output->buffer_size_ = output->buffer_size_ + -1;
    }
    uVar10 = this->_path_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,uVar10);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar8 = pbVar1;
      uVar9 = uVar10;
      if (0x7f < uVar10) {
        do {
          *pbVar8 = (byte)uVar10 | 0x80;
          uVar9 = uVar10 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar4 = 0x3fff < uVar10;
          uVar10 = uVar9;
        } while (bVar4);
      }
      *pbVar8 = (byte)uVar9;
      iVar6 = ((int)pbVar8 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar6;
      output->buffer_size_ = output->buffer_size_ - iVar6;
    }
  }
  iVar6 = (this->path_).current_size_;
  if (0 < iVar6) {
    index = 0;
    do {
      puVar5 = (uint *)RepeatedField<int>::Get(&this->path_,index);
      value = (ulong)(int)*puVar5;
      if (output->buffer_size_ < 10) {
        io::CodedOutputStream::WriteVarint64SlowPath(output,value);
      }
      else {
        pbVar1 = output->buffer_;
        pbVar8 = pbVar1;
        uVar11 = value;
        if (0x7f < *puVar5) {
          do {
            *pbVar8 = (byte)uVar11 | 0x80;
            value = uVar11 >> 7;
            pbVar8 = pbVar8 + 1;
            bVar4 = 0x3fff < uVar11;
            uVar11 = value;
          } while (bVar4);
        }
        *pbVar8 = (byte)value;
        iVar7 = ((int)pbVar8 - (int)pbVar1) + 1;
        output->buffer_ = output->buffer_ + iVar7;
        output->buffer_size_ = output->buffer_size_ - iVar7;
      }
      index = index + 1;
    } while (index != iVar6);
  }
  uVar10 = (this->_has_bits_).has_bits_[0];
  if ((uVar10 & 1) != 0) {
    psVar2 = (this->source_file_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    internal::WireFormatLite::WriteStringMaybeAliased(2,(this->source_file_).ptr_,output);
  }
  if ((uVar10 & 2) != 0) {
    internal::WireFormatLite::WriteInt32(3,this->begin_,output);
  }
  if ((uVar10 & 4) != 0) {
    internal::WireFormatLite::WriteInt32(4,this->end_,output);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    internal::WireFormat::SerializeUnknownFields
              ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),output);
    return;
  }
  return;
}

Assistant:

void GeneratedCodeInfo_Annotation::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  if (this->path_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_path_cached_byte_size_);
  }
  for (int i = 0, n = this->path_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32NoTag(
      this->path(i), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional string source_file = 2;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source_file().data(), this->source_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->source_file(), output);
  }

  // optional int32 begin = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(3, this->begin(), output);
  }

  // optional int32 end = 4;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(4, this->end(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.GeneratedCodeInfo.Annotation)
}